

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O2

int __thiscall
TPZFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
::Subst_Forward(TPZFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
                *this,TPZFMatrix<std::complex<double>_> *b)

{
  DecomposeType dec;
  
  std::operator<<((ostream *)&std::cout,"Entering Forward Substitution\n");
  std::ostream::flush();
  dec = TPZFrontSym<std::complex<double>_>::GetDecomposeType(&this->fFront);
  TPZFileEqnStorage<std::complex<double>_>::Forward(&this->fStorage,b,dec);
  return 1;
}

Assistant:

int TPZFrontMatrix<TVar,store, front>::Subst_Forward(TPZFMatrix<TVar> *b) const {
	cout << "Entering Forward Substitution\n";
	cout.flush();
	DecomposeType dec = fFront.GetDecomposeType();
//	if(dec != ECholesky) cout << "TPZFrontMatrix::Subst_Forward non matching decomposition\n";
	fStorage.Forward(*b, dec);
	return 1;
}